

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O3

void modifyMultipart(void)

{
  size_t sVar1;
  pointer pHVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Header *pHVar7;
  undefined8 *puVar8;
  int i;
  long lVar9;
  long lVar10;
  Array2D<unsigned_int> sampleCount;
  DeepTiledInputPart inputPart;
  list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
  halfChannels;
  list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
  intChannels;
  MultiPartOutputFile outputFile;
  MultiPartInputFile inputFile;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> floatChannels;
  DeepFrameBuffer frameBuffer;
  Array2D<unsigned_int> local_158;
  undefined1 local_138 [8];
  undefined1 local_130 [24];
  undefined1 local_118 [40];
  MultiPartInputFile local_f0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_d0;
  long local_b8;
  TiledInputPart *local_b0;
  TiledInputPart *local_a8;
  undefined8 local_a0;
  DeepFrameBuffer local_98;
  
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_f0,"multipart.exr",iVar3,true);
  iVar3 = Imf_3_4::MultiPartInputFile::parts();
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            (&local_d0,(long)iVar3,(allocator_type *)&local_98);
  lVar10 = 0;
  lVar9 = 0;
  while( true ) {
    iVar3 = Imf_3_4::MultiPartInputFile::parts();
    pHVar2 = local_d0.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar3 <= lVar9) break;
    pHVar7 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_f0);
    Imf_3_4::Header::operator=
              (local_d0.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
               _M_impl.super__Vector_impl_data._M_start + lVar10,pHVar7);
    lVar9 = lVar9 + 1;
    lVar10 = lVar10 + 0x38;
  }
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)(local_118 + 0x18),"modified.exr",pHVar2,
             (int)((ulong)((long)local_d0.
                                 super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar2) >> 3) *
             -0x49249249,false,iVar3);
  lVar10 = 0;
  lVar9 = 0;
  do {
    iVar3 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar3 <= lVar9) {
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)(local_118 + 0x18));
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&local_d0);
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      }
      if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
      }
      return;
    }
    pHVar7 = local_d0.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
             super__Vector_impl_data._M_start + lVar10;
    local_b8 = lVar10;
    puVar8 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar1 = puVar8[1];
    iVar3 = (int)lVar9;
    if (sVar1 == DAT_0011a890) {
      if (sVar1 != 0) {
        iVar4 = bcmp((void *)*puVar8,Imf_3_4::SCANLINEIMAGE_abi_cxx11_,sVar1);
        if (iVar4 != 0) goto LAB_001117b9;
      }
LAB_00111977:
      local_158._data = (uint *)0x0;
      local_118._0_8_ = local_118;
      local_118._16_8_ = (_Base_ptr)0x0;
      local_130._0_8_ = local_130;
      local_130._16_8_ = (_Base_ptr)0x0;
      local_158._sizeX = (long)&local_158;
      local_158._sizeY = (long)&local_158;
      local_130._8_8_ = local_130._0_8_;
      local_118._8_8_ = local_118._0_8_;
      setupFramebuffer((FrameBuffer *)&local_98,pHVar7,
                       (list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                        *)&local_158,
                       (list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                        *)local_118._0_8_,
                       (list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
                       local_130._0_8_);
      sVar1 = puVar8[1];
      iVar4 = (int)(TiledInputPart *)&local_b0;
      if (sVar1 == DAT_0011a890) {
        if (sVar1 != 0) {
          iVar5 = bcmp((void *)*puVar8,Imf_3_4::SCANLINEIMAGE_abi_cxx11_,sVar1);
          if (iVar5 != 0) goto LAB_001119e7;
        }
        Imf_3_4::InputPart::InputPart((InputPart *)&local_b0,local_f0,iVar3);
        Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&local_b0);
        lVar10 = Imf_3_4::Header::dataWindow();
        iVar5 = *(int *)(lVar10 + 4);
        Imf_3_4::Header::dataWindow();
        Imf_3_4::InputPart::readPixels(iVar4,iVar5);
      }
      else {
LAB_001119e7:
        Imf_3_4::TiledInputPart::TiledInputPart((TiledInputPart *)&local_b0,local_f0,iVar3);
        Imf_3_4::TiledInputPart::setFrameBuffer((FrameBuffer *)&local_b0);
        iVar5 = Imf_3_4::TiledInputPart::numXTiles(iVar4);
        iVar6 = Imf_3_4::TiledInputPart::numYTiles(iVar4);
        Imf_3_4::TiledInputPart::readTiles(iVar4,0,iVar5 + -1,0,iVar6 + -1);
      }
      modifyChannels<unsigned_int>
                ((list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                  *)&local_158,1);
      modifyChannels<Imath_3_2::half>
                ((list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                  *)local_118,(half)0x34cd);
      modifyChannels<float>
                ((list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
                 local_130,0.5);
      sVar1 = puVar8[1];
      if (sVar1 == DAT_0011a890) {
        if (sVar1 != 0) {
          iVar5 = bcmp((void *)*puVar8,Imf_3_4::SCANLINEIMAGE_abi_cxx11_,sVar1);
          if (iVar5 != 0) goto LAB_00111ad2;
        }
        Imf_3_4::Header::dataWindow();
        Imf_3_4::OutputPart::OutputPart
                  ((OutputPart *)&local_b0,(MultiPartOutputFile *)(local_118 + 0x18),iVar3);
        Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&local_b0);
        Imf_3_4::OutputPart::writePixels(iVar4);
      }
      else {
LAB_00111ad2:
        Imf_3_4::TiledOutputPart::TiledOutputPart
                  ((TiledOutputPart *)&local_b0,(MultiPartOutputFile *)(local_118 + 0x18),iVar3);
        Imf_3_4::TiledOutputPart::setFrameBuffer((FrameBuffer *)&local_b0);
        iVar3 = Imf_3_4::TiledOutputPart::numXTiles(iVar4);
        iVar5 = Imf_3_4::TiledOutputPart::numYTiles(iVar4);
        Imf_3_4::TiledOutputPart::writeTiles(iVar4,0,iVar3 + -1,0,iVar5 + -1);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&local_98);
      std::__cxx11::_List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>::
      _M_clear((_List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
               local_130);
      std::__cxx11::
      _List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
      ::_M_clear((_List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                  *)local_118);
      std::__cxx11::
      _List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>::
      _M_clear((_List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                *)&local_158);
    }
    else {
LAB_001117b9:
      if (sVar1 == DAT_0011a8b0) {
        if (sVar1 != 0) {
          iVar4 = bcmp((void *)*puVar8,Imf_3_4::TILEDIMAGE_abi_cxx11_,sVar1);
          if (iVar4 != 0) goto LAB_001117e5;
        }
        goto LAB_00111977;
      }
LAB_001117e5:
      if (sVar1 == DAT_0011a8d0) {
        if (sVar1 != 0) {
          iVar4 = bcmp((void *)*puVar8,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar1);
          if (iVar4 != 0) goto LAB_00111809;
        }
LAB_00111835:
        local_158._sizeX = 0;
        local_158._sizeY = 0;
        local_158._data = (uint *)0x0;
        local_118._0_8_ = local_118;
        local_118._16_8_ = (_Base_ptr)0x0;
        local_130._0_8_ = local_130;
        local_130._16_8_ = (_Base_ptr)0x0;
        local_a0 = 0;
        local_130._8_8_ = local_130._0_8_;
        local_118._8_8_ = local_118._0_8_;
        local_b0 = (TiledInputPart *)&local_b0;
        local_a8 = (TiledInputPart *)&local_b0;
        setupDeepFramebuffer
                  (&local_98,pHVar7,&local_158,
                   (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)local_118._0_8_,
                   (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                    *)local_130._0_8_,
                   (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
                   &local_b0);
        sVar1 = puVar8[1];
        if (sVar1 == DAT_0011a8d0) {
          if (sVar1 != 0) {
            iVar4 = bcmp((void *)*puVar8,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar1);
            if (iVar4 != 0) goto LAB_001118cb;
          }
          Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)local_138,local_f0,iVar3);
          Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)local_138);
          lVar10 = Imf_3_4::Header::dataWindow();
          iVar4 = *(int *)(lVar10 + 4);
          Imf_3_4::Header::dataWindow();
          Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)local_138,iVar4);
          resizeDeepBuffers<unsigned_int>
                    (&local_158,
                     (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                      *)local_118);
          resizeDeepBuffers<Imath_3_2::half>
                    (&local_158,
                     (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                      *)local_130);
          resizeDeepBuffers<float>
                    (&local_158,
                     (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *
                     )&local_b0);
          lVar10 = Imf_3_4::Header::dataWindow();
          iVar4 = *(int *)(lVar10 + 4);
          Imf_3_4::Header::dataWindow();
          Imf_3_4::DeepScanLineInputPart::readPixels((int)local_138,iVar4);
        }
        else {
LAB_001118cb:
          Imf_3_4::DeepTiledInputPart::DeepTiledInputPart
                    ((DeepTiledInputPart *)local_138,local_f0,iVar3);
          Imf_3_4::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)local_138);
          iVar6 = (int)(DeepFrameBuffer *)local_138;
          iVar4 = Imf_3_4::DeepTiledInputPart::numXTiles(iVar6);
          iVar5 = Imf_3_4::DeepTiledInputPart::numYTiles(iVar6);
          Imf_3_4::DeepTiledInputPart::readPixelSampleCounts(iVar6,0,iVar4 + -1,0,iVar5 + -1);
          resizeDeepBuffers<unsigned_int>
                    (&local_158,
                     (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                      *)local_118);
          resizeDeepBuffers<Imath_3_2::half>
                    (&local_158,
                     (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                      *)local_130);
          resizeDeepBuffers<float>
                    (&local_158,
                     (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *
                     )&local_b0);
          iVar4 = Imf_3_4::DeepTiledInputPart::numXTiles(iVar6);
          iVar5 = Imf_3_4::DeepTiledInputPart::numYTiles(iVar6);
          Imf_3_4::DeepTiledInputPart::readTiles(iVar6,0,iVar4 + -1,0,iVar5 + -1);
        }
        modifyDeepChannels<unsigned_int>
                  (&local_158,
                   (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)local_118,1);
        modifyDeepChannels<Imath_3_2::half>
                  (&local_158,
                   (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                    *)local_130,(half)0x34cd);
        modifyDeepChannels<float>
                  (&local_158,
                   (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
                   &local_b0,0.5);
        sVar1 = puVar8[1];
        if (sVar1 == DAT_0011a8d0) {
          if (sVar1 != 0) {
            iVar4 = bcmp((void *)*puVar8,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar1);
            if (iVar4 != 0) goto LAB_00111c88;
          }
          Imf_3_4::Header::dataWindow();
          Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart
                    ((DeepScanLineOutputPart *)local_138,(MultiPartOutputFile *)(local_118 + 0x18),
                     iVar3);
          Imf_3_4::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)local_138);
          Imf_3_4::DeepScanLineOutputPart::writePixels((int)(DeepFrameBuffer *)local_138);
        }
        else {
LAB_00111c88:
          Imf_3_4::DeepTiledOutputPart::DeepTiledOutputPart
                    ((DeepTiledOutputPart *)local_138,(MultiPartOutputFile *)(local_118 + 0x18),
                     iVar3);
          Imf_3_4::DeepTiledOutputPart::setFrameBuffer((DeepFrameBuffer *)local_138);
          iVar5 = (int)(DeepFrameBuffer *)local_138;
          iVar3 = Imf_3_4::DeepTiledOutputPart::numXTiles(iVar5);
          iVar4 = Imf_3_4::DeepTiledOutputPart::numYTiles(iVar5);
          Imf_3_4::DeepTiledOutputPart::writeTiles(iVar5,0,iVar3 + -1,0,iVar4 + -1);
        }
        freeDeepBuffers<unsigned_int>
                  ((list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)local_118);
        freeDeepBuffers<Imath_3_2::half>
                  ((list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                    *)local_130);
        freeDeepBuffers<float>
                  ((list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
                   &local_b0);
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                     *)&local_98);
        std::__cxx11::
        _List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>::_M_clear
                  ((_List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
                    *)&local_b0);
        std::__cxx11::
        _List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
        ::_M_clear((_List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                    *)local_130);
        std::__cxx11::
        _List_base<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
        ::_M_clear((_List_base<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)local_118);
        if (local_158._data != (uint *)0x0) {
          operator_delete__(local_158._data);
        }
      }
      else {
LAB_00111809:
        if (sVar1 == DAT_0011a8f0) {
          if (sVar1 != 0) {
            iVar4 = bcmp((void *)*puVar8,Imf_3_4::DEEPTILE_abi_cxx11_,sVar1);
            if (iVar4 != 0) goto LAB_00111d7c;
          }
          goto LAB_00111835;
        }
      }
    }
LAB_00111d7c:
    lVar9 = lVar9 + 1;
    lVar10 = local_b8 + 0x38;
  } while( true );
}

Assistant:

void
modifyMultipart ()
{
    //
    // Read all channels from a multi-part file, modify each pixel value, write the modified data as a multi-part file.
    // The parts in the file can be scanline- or tile-based, either flat or deep.
    // Every channel of the input file gets modified.
    //

    MultiPartInputFile inputFile ("multipart.exr");

    std::vector<Header> headers (inputFile.parts ());

    for (int i = 0; i < inputFile.parts (); i++)
    {
        headers[i] = inputFile.header (i);
    }

    MultiPartOutputFile outputFile (
        "modified.exr", headers.data (), (int) headers.size ());

    for (int i = 0; i < inputFile.parts (); i++)
    {
        Header& header = headers[i];

        const string& type = header.type ();

        if (type == SCANLINEIMAGE || type == TILEDIMAGE)
        {
            list<Array2D<uint32_t>> intChannels;
            list<Array2D<half>>     halfChannels;
            list<Array2D<float>>    floatChannels;

            FrameBuffer frameBuffer = setupFramebuffer (
                header, intChannels, halfChannels, floatChannels);

            if (type == SCANLINEIMAGE)
            {
                InputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readPixels (
                    header.dataWindow ().min.y, header.dataWindow ().max.y);
            }
            else
            {
                TiledInputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readTiles (
                    0,
                    inputPart.numXTiles () - 1,
                    0,
                    inputPart.numYTiles () - 1);
            }

            modifyChannels<uint32_t> (intChannels, 1);
            modifyChannels<half> (halfChannels, 0.3);
            modifyChannels<float> (floatChannels, 0.5);

            if (type == SCANLINEIMAGE)
            {
                Box2i      dataWindow = header.dataWindow ();
                OutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writePixels (
                    dataWindow.max.y - dataWindow.min.y + 1);
            }
            else
            {
                TiledOutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writeTiles (
                    0,
                    outputPart.numXTiles () - 1,
                    0,
                    outputPart.numYTiles () - 1);
            }
        }
        else if (type == DEEPSCANLINE || type == DEEPTILE)
        {
            Array2D<uint32_t>        sampleCount;
            list<Array2D<uint32_t*>> intChannels;
            list<Array2D<half*>>     halfChannels;
            list<Array2D<float*>>    floatChannels;

            DeepFrameBuffer frameBuffer = setupDeepFramebuffer (
                header, sampleCount, intChannels, halfChannels, floatChannels);

            if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readPixelSampleCounts (
                    header.dataWindow ().min.y, header.dataWindow ().max.y);

                resizeDeepBuffers<uint32_t> (sampleCount, intChannels);
                resizeDeepBuffers<half> (sampleCount, halfChannels);
                resizeDeepBuffers<float> (sampleCount, floatChannels);

                inputPart.readPixels (
                    header.dataWindow ().min.y, header.dataWindow ().max.y);
            }
            else
            {
                DeepTiledInputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readPixelSampleCounts (
                    0,
                    inputPart.numXTiles () - 1,
                    0,
                    inputPart.numYTiles () - 1);

                resizeDeepBuffers<uint32_t> (sampleCount, intChannels);
                resizeDeepBuffers<half> (sampleCount, halfChannels);
                resizeDeepBuffers<float> (sampleCount, floatChannels);

                inputPart.readTiles (
                    0,
                    inputPart.numXTiles () - 1,
                    0,
                    inputPart.numYTiles () - 1);
            }

            modifyDeepChannels<uint32_t> (sampleCount, intChannels, 1);
            modifyDeepChannels<half> (sampleCount, halfChannels, 0.3);
            modifyDeepChannels<float> (sampleCount, floatChannels, 0.5);

            if (type == DEEPSCANLINE)
            {
                Box2i                  dataWindow = header.dataWindow ();
                DeepScanLineOutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writePixels (
                    dataWindow.max.y - dataWindow.min.y + 1);
            }
            else
            {
                DeepTiledOutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writeTiles (
                    0,
                    outputPart.numXTiles () - 1,
                    0,
                    outputPart.numYTiles () - 1);
            }

            freeDeepBuffers (intChannels);
            freeDeepBuffers (halfChannels);
            freeDeepBuffers (floatChannels);
        }
    }
}